

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraHot.c
# Opt level: O2

int Fra_OneHotCount(Fra_Man_t *p,Vec_Int_t *vOneHots)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int i;
  
  iVar3 = 0;
  for (i = 0; i < vOneHots->nSize; i = i + 2) {
    iVar1 = Vec_IntEntry(vOneHots,i);
    iVar2 = Vec_IntEntry(vOneHots,i + 1);
    iVar3 = iVar3 + (uint)(iVar2 != 0 || iVar1 != 0);
  }
  return iVar3;
}

Assistant:

int Fra_OneHotCount( Fra_Man_t * p, Vec_Int_t * vOneHots )
{
    int i, Out1, Out2, Counter = 0;
    for ( i = 0; i < Vec_IntSize(vOneHots); i += 2 )
    {
        Out1 = Vec_IntEntry( vOneHots, i );
        Out2 = Vec_IntEntry( vOneHots, i+1 );
        if ( Out1 == 0 && Out2 == 0 )
            continue;
        Counter++;
    }
    return Counter;
}